

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

double __thiscall
TopCymbalOperator::getOperatorOutput
          (TopCymbalOperator *this,OPL3 *OPL3,double modulator,double externalPhase)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = EnvelopeGenerator::getEnvelope
                    (&(this->super_Operator).envelopeGenerator,OPL3,(this->super_Operator).egt,
                     (this->super_Operator).am);
  dVar5 = 0.0;
  if (-120.0 <= dVar3) {
    dVar5 = ::OPL3::OperatorData->dbpow[SUB84(dVar3 * -4.0 + 6755399441055744.0,0)];
  }
  (this->super_Operator).envelope = dVar5;
  dVar3 = (this->super_Operator).phaseGenerator.phaseIncrement;
  if ((this->super_Operator).vib == 1) {
    dVar3 = dVar3 * ::OPL3::OPL3Data->vibratoTable[OPL3->dvb][OPL3->vibratoIndex];
  }
  dVar3 = dVar3 + (this->super_Operator).phaseGenerator.phase;
  (this->super_Operator).phaseGenerator.phase = dVar3;
  (this->super_Operator).phase = dVar3;
  uVar2 = ((long)(OPL3->_new << 2) | 3U) & (long)(this->super_Operator).ws;
  dVar1 = ::OPL3::OperatorData->waveforms[uVar2]
          [SUB84((::OPL3::OperatorData->waveforms[uVar2]
                  [SUB84(externalPhase * 1024.0 + 6755399441055744.0,0) & 0x3ff] * dVar5 +
                 dVar3 * 8.0) * 1024.0 + 6755399441055744.0,0) & 0x3ff];
  dVar4 = floor(dVar3 * 8.0);
  return (double)(~-(ulong)(0.1 < dVar4 * -4.0 + dVar3 * 32.0) & (ulong)((dVar1 + dVar1) * dVar5));
}

Assistant:

double TopCymbalOperator::getOperatorOutput(OPL3 *OPL3, double modulator, double externalPhase) {
	double envelopeInDB = envelopeGenerator.getEnvelope(OPL3, egt, am);
	envelope = EnvelopeFromDB(envelopeInDB);
	
	phase = phaseGenerator.getPhase(OPL3, vib);
	
	int waveIndex = ws & ((OPL3->_new<<2) + 3); 
	double *waveform = OPL3::OperatorData->waveforms[waveIndex];
	
	// Empirically tested multiplied phase for the Top Cymbal:
	double carrierPhase = 8 * phase;
	double modulatorPhase = externalPhase;
	double modulatorOutput = getOutput(Operator::noModulator, modulatorPhase, waveform);
	double carrierOutput = getOutput(modulatorOutput, carrierPhase, waveform);
	
	int cycles = 4;
	double chopped = (carrierPhase * cycles) /* %cycles */;
	chopped = chopped - floor(chopped / cycles) * cycles;
	if( chopped > 0.1) carrierOutput = 0;
	
	return carrierOutput*2;  
}